

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O1

void Assimp::SceneCombiner::Copy(aiMeshMorphAnim **_dest,aiMeshMorphAnim *src)

{
  aiMeshMorphKey *__dest;
  undefined8 *puVar1;
  aiMeshMorphKey *paVar2;
  aiMeshMorphAnim *__dest_00;
  ulong *puVar3;
  size_t sVar4;
  void *pvVar5;
  size_t __n;
  ulong uVar6;
  long lVar7;
  
  if (src != (aiMeshMorphAnim *)0x0 && _dest != (aiMeshMorphAnim **)0x0) {
    __dest_00 = (aiMeshMorphAnim *)operator_new(0x410);
    (__dest_00->mName).length = 0;
    (__dest_00->mName).data[0] = '\0';
    memset((__dest_00->mName).data + 1,0x1b,0x3ff);
    __dest_00->mNumKeys = 0;
    __dest_00->mKeys = (aiMeshMorphKey *)0x0;
    *_dest = __dest_00;
    memcpy(__dest_00,src,0x410);
    paVar2 = __dest_00->mKeys;
    if (paVar2 != (aiMeshMorphKey *)0x0) {
      uVar6 = (ulong)__dest_00->mNumKeys;
      __n = uVar6 * 0x20;
      puVar3 = (ulong *)operator_new__(__n + 8);
      __dest = (aiMeshMorphKey *)(puVar3 + 1);
      *puVar3 = uVar6;
      if (uVar6 != 0) {
        sVar4 = 0;
        do {
          puVar1 = (undefined8 *)((long)puVar3 + sVar4 + 0x14);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)&__dest->mTime + sVar4);
          *puVar1 = 0;
          puVar1[1] = 0;
          sVar4 = sVar4 + 0x20;
        } while (__n != sVar4);
      }
      __dest_00->mKeys = __dest;
      memcpy(__dest,paVar2,__n);
    }
    if (__dest_00->mNumKeys != 0) {
      lVar7 = 0;
      uVar6 = 0;
      do {
        paVar2 = __dest_00->mKeys;
        pvVar5 = operator_new__((ulong)*(uint *)((long)&paVar2->mNumValuesAndWeights + lVar7) << 2);
        *(void **)((long)&paVar2->mValues + lVar7) = pvVar5;
        paVar2 = __dest_00->mKeys;
        pvVar5 = operator_new__((ulong)*(uint *)((long)&paVar2->mNumValuesAndWeights + lVar7) << 3);
        *(void **)((long)&paVar2->mWeights + lVar7) = pvVar5;
        memcpy(*(void **)((long)&__dest_00->mKeys->mValues + lVar7),
               *(void **)((long)&src->mKeys->mValues + lVar7),
               (ulong)*(uint *)((long)&__dest_00->mKeys->mNumValuesAndWeights + lVar7) << 2);
        memcpy(*(void **)((long)&__dest_00->mKeys->mWeights + lVar7),
               *(void **)((long)&src->mKeys->mWeights + lVar7),
               (ulong)*(uint *)((long)&__dest_00->mKeys->mNumValuesAndWeights + lVar7) << 3);
        uVar6 = uVar6 + 1;
        lVar7 = lVar7 + 0x20;
      } while (uVar6 < __dest_00->mNumKeys);
    }
  }
  return;
}

Assistant:

void SceneCombiner::Copy(aiMeshMorphAnim** _dest, const aiMeshMorphAnim* src) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    aiMeshMorphAnim* dest = *_dest = new aiMeshMorphAnim();

    // get a flat copy
    ::memcpy(dest,src,sizeof(aiMeshMorphAnim));

    // and reallocate all arrays
    GetArrayCopy( dest->mKeys, dest->mNumKeys );
    for (ai_uint i = 0; i < dest->mNumKeys;++i) {
        dest->mKeys[i].mValues = new unsigned int[dest->mKeys[i].mNumValuesAndWeights];
        dest->mKeys[i].mWeights = new double[dest->mKeys[i].mNumValuesAndWeights];
        ::memcpy(dest->mKeys[i].mValues, src->mKeys[i].mValues, dest->mKeys[i].mNumValuesAndWeights * sizeof(unsigned int));
        ::memcpy(dest->mKeys[i].mWeights, src->mKeys[i].mWeights, dest->mKeys[i].mNumValuesAndWeights * sizeof(double));
    }
}